

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__simple_alpha_weight_2ch(float *decode_buffer,int width_times_channels)

{
  float *decode;
  float *pfVar1;
  
  pfVar1 = decode_buffer;
  while (pfVar1 + 8 <= decode_buffer + width_times_channels) {
    *pfVar1 = pfVar1[1] * *pfVar1;
    pfVar1[1] = pfVar1[1] * 1.0;
    pfVar1[2] = pfVar1[3] * pfVar1[2];
    pfVar1[3] = pfVar1[3] * 1.0;
    pfVar1[4] = pfVar1[5] * pfVar1[4];
    pfVar1[5] = pfVar1[5] * 1.0;
    pfVar1[6] = pfVar1[7] * pfVar1[6];
    pfVar1[7] = pfVar1[7] * 1.0;
    pfVar1 = pfVar1 + 8;
  }
  for (; pfVar1 < decode_buffer + width_times_channels; pfVar1 = pfVar1 + 2) {
    *pfVar1 = pfVar1[1] * *pfVar1;
  }
  return;
}

Assistant:

static void stbir__simple_alpha_weight_2ch( float * decode_buffer, int width_times_channels )
{
  float STBIR_STREAMOUT_PTR(*) decode = decode_buffer;
  float const * end_decode = decode_buffer + width_times_channels;

  #ifdef STBIR_SIMD
  decode += 2 * stbir__simdfX_float_count;
  STBIR_NO_UNROLL_LOOP_START
  while ( decode <= end_decode )
  {
    stbir__simdfX d0,a0,d1,a1;
    STBIR_NO_UNROLL(decode);
    stbir__simdfX_load( d0, decode-2*stbir__simdfX_float_count );
    stbir__simdfX_load( d1, decode-2*stbir__simdfX_float_count+stbir__simdfX_float_count );
    stbir__simdfX_a1a1( a0, d0, STBIR_onesX );
    stbir__simdfX_a1a1( a1, d1, STBIR_onesX );
    stbir__simdfX_mult( d0, d0, a0 );
    stbir__simdfX_mult( d1, d1, a1 );
    stbir__simdfX_store ( decode-2*stbir__simdfX_float_count, d0 );
    stbir__simdfX_store ( decode-2*stbir__simdfX_float_count+stbir__simdfX_float_count, d1 );
    decode += 2 * stbir__simdfX_float_count;
  }
  decode -= 2 * stbir__simdfX_float_count;
  #endif

  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode < end_decode )
  {
    float alpha = decode[1];
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0] *= alpha;
    decode += 2;
  }
}